

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

bool __thiscall DOptionMenu::MouseEvent(DOptionMenu *this,int type,int x,int y)

{
  uint uVar1;
  FOptionMenuItem **ppFVar2;
  uint y_00;
  uint local_28;
  int yline;
  int y_local;
  int x_local;
  int type_local;
  DOptionMenu *this_local;
  
  y_00 = y / CleanYfac_1 - this->mDesc->mDrawTop;
  if (this->mFocusControl == (FOptionMenuItem *)0x0) {
    local_28 = (int)y_00 / OptionSettings.mLinespacing;
    if (this->mDesc->mScrollTop <= (int)local_28) {
      local_28 = this->mDesc->mScrollPos + local_28;
    }
    uVar1 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                      (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
    if (local_28 < uVar1) {
      ppFVar2 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                          (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                           ,(long)(int)local_28);
      uVar1 = (*((*ppFVar2)->super_FListMenuItem)._vptr_FListMenuItem[5])();
      if ((uVar1 & 1) != 0) {
        if (local_28 != this->mDesc->mSelectedItem) {
          this->mDesc->mSelectedItem = local_28;
        }
        ppFVar2 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                            (&(this->mDesc->mItems).
                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,(long)(int)local_28
                            );
        (*((*ppFVar2)->super_FListMenuItem)._vptr_FListMenuItem[0xe])
                  (*ppFVar2,(ulong)(uint)type,(ulong)(uint)x,(ulong)y_00);
        return true;
      }
    }
    this->mDesc->mSelectedItem = -1;
    this_local._7_1_ = DMenu::MouseEvent(&this->super_DMenu,type,x,y_00);
  }
  else {
    (*(this->mFocusControl->super_FListMenuItem)._vptr_FListMenuItem[0xe])
              (this->mFocusControl,(ulong)(uint)type,(ulong)(uint)x,(ulong)y_00);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DOptionMenu::MouseEvent(int type, int x, int y)
{
	y = (y / CleanYfac_1) - mDesc->mDrawTop;

	if (mFocusControl)
	{
		mFocusControl->MouseEvent(type, x, y);
		return true;
	}
	else
	{
		int yline = (y / OptionSettings.mLinespacing);
		if (yline >= mDesc->mScrollTop)
		{
			yline += mDesc->mScrollPos;
		}
		if ((unsigned)yline < mDesc->mItems.Size() && mDesc->mItems[yline]->Selectable())
		{
			if (yline != mDesc->mSelectedItem)
			{
				mDesc->mSelectedItem = yline;
				//S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			}
			mDesc->mItems[yline]->MouseEvent(type, x, y);
			return true;
		}
	}
	mDesc->mSelectedItem = -1;
	return Super::MouseEvent(type, x, y);
}